

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_msa_vec(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  uVar1 = ctx->opcode & 0xffe0003f;
  if ((((uVar1 == 0x7800001e) || (uVar1 == 0x7820001e)) || (uVar1 == 0x7840001e)) ||
     (((uVar1 == 0x7860001e || (uVar1 == 0x7880001e)) ||
      ((uVar1 == 0x78a0001e || (uVar1 == 0x78c0001e)))))) {
    gen_msa_vec_v(env,ctx);
  }
  else if (uVar1 == 0x7b00001e) {
    gen_msa_2r(env,ctx);
  }
  else if (uVar1 == 0x7b20001e) {
    gen_msa_2rf(env,ctx);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_msa_vec(CPUMIPSState *env, DisasContext *ctx)
{
    switch (MASK_MSA_VEC(ctx->opcode)) {
    case OPC_AND_V:
    case OPC_OR_V:
    case OPC_NOR_V:
    case OPC_XOR_V:
    case OPC_BMNZ_V:
    case OPC_BMZ_V:
    case OPC_BSEL_V:
        gen_msa_vec_v(env, ctx);
        break;
    case OPC_MSA_2R:
        gen_msa_2r(env, ctx);
        break;
    case OPC_MSA_2RF:
        gen_msa_2rf(env, ctx);
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}